

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

void __thiscall Json::Value::Value(Value *this,string *value)

{
  char *pcVar1;
  
  *(ushort *)&this->field_0x8 = (ushort)*(undefined4 *)&this->field_0x8 & 0xfe00 | 0x105;
  this->comments_ = (CommentInfo *)0x0;
  this->start_ = 0;
  this->limit_ = 0;
  pcVar1 = duplicateAndPrefixStringValue((value->_M_dataplus)._M_p,(uint)value->_M_string_length);
  (this->value_).string_ = pcVar1;
  return;
}

Assistant:

Value::Value(const std::string& value) {
  initBasic(stringValue, true);
  value_.string_ =
      duplicateAndPrefixStringValue(value.data(), static_cast<unsigned>(value.length()));
}